

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::SubdivPatch1MBIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  GridSOA *pGVar11;
  RTCFilterFunctionN p_Var12;
  size_t sVar13;
  uint uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 (*pauVar65) [16];
  long lVar66;
  long lVar67;
  uint uVar68;
  undefined1 (*pauVar69) [16];
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  char *pcVar75;
  ulong uVar76;
  char *pcVar77;
  Geometry *pGVar78;
  AABBNodeMB4D *node1;
  ulong uVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar87 [64];
  float fVar102;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar104;
  undefined1 auVar97 [32];
  float fVar103;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar109;
  float fVar110;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar111;
  float fVar120;
  float fVar122;
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar113 [16];
  float fVar126;
  float fVar128;
  float fVar130;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar129;
  float fVar131;
  float fVar132;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar153 [32];
  float fVar158;
  undefined1 auVar154 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar171;
  float fVar173;
  undefined1 auVar165 [16];
  float fVar177;
  float fVar179;
  float fVar181;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar190;
  undefined1 auVar184 [16];
  float fVar183;
  float fVar188;
  float fVar189;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar195;
  float fVar196;
  float fVar205;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar198 [16];
  float fVar194;
  float fVar204;
  float fVar207;
  float fVar211;
  float fVar213;
  float fVar215;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar212;
  float fVar214;
  float fVar216;
  undefined1 auVar203 [32];
  float fVar217;
  float fVar220;
  float fVar221;
  undefined1 auVar218 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar219 [32];
  float fVar226;
  float fVar229;
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  float fVar230;
  float fVar231;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar232 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar233 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined1 local_1460 [8];
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  char *local_13d8;
  ulong local_13d0;
  ulong local_13c8;
  undefined8 local_13c0;
  undefined1 auStack_13b8 [8];
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  undefined1 local_13a0 [8];
  float fStack_1398;
  float fStack_1394;
  undefined1 auStack_1390 [8];
  float fStack_1388;
  undefined1 local_1380 [32];
  undefined1 local_1360 [8];
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1330 [16];
  undefined1 (*local_1318) [16];
  RTCFilterFunctionNArguments local_1310;
  undefined1 local_12e0 [8];
  undefined8 uStack_12d8;
  undefined1 auStack_12d0 [8];
  float fStack_12c8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [8];
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [8];
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [32];
  char **local_11e0;
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined4 local_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c8;
  undefined4 uStack_10c4;
  undefined1 local_10c0 [16];
  undefined1 local_10b0 [16];
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float local_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined1 local_1070 [16];
  uint local_1060;
  uint uStack_105c;
  uint uStack_1058;
  uint uStack_1054;
  uint uStack_1050;
  uint uStack_104c;
  uint uStack_1048;
  uint uStack_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar197 [16];
  undefined1 auVar199 [24];
  undefined1 auVar202 [32];
  
  pauVar69 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar218._4_4_ = uVar3;
  auVar218._0_4_ = uVar3;
  auVar218._8_4_ = uVar3;
  auVar218._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar227._4_4_ = uVar3;
  auVar227._0_4_ = uVar3;
  auVar227._8_4_ = uVar3;
  auVar227._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar232._4_4_ = uVar3;
  auVar232._0_4_ = uVar3;
  auVar232._8_4_ = uVar3;
  auVar232._12_4_ = uVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar76 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar74 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar7 = (tray->tnear).field_0.i[k];
  auVar165._4_4_ = iVar7;
  auVar165._0_4_ = iVar7;
  auVar165._8_4_ = iVar7;
  auVar165._12_4_ = iVar7;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar87 = ZEXT1664(CONCAT412(iVar7,CONCAT48(iVar7,CONCAT44(iVar7,iVar7))));
  local_1318 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_00349c68:
  pauVar65 = pauVar69 + -1;
  pauVar69 = pauVar69 + -1;
  if (*(float *)(*pauVar65 + 8) <= *(float *)(ray + k * 4 + 0x80)) goto code_r0x00349c81;
  goto LAB_0034ab68;
code_r0x00349c81:
  uVar73 = *(ulong *)*pauVar69;
  while ((uVar73 & 8) == 0) {
    uVar79 = uVar73 & 0xfffffffffffffff0;
    fVar81 = *(float *)(ray + k * 4 + 0x70);
    auVar93._4_4_ = fVar81;
    auVar93._0_4_ = fVar81;
    auVar93._8_4_ = fVar81;
    auVar93._12_4_ = fVar81;
    pfVar2 = (float *)(uVar79 + 0x80 + uVar76);
    pfVar1 = (float *)(uVar79 + 0x20 + uVar76);
    auVar105._0_4_ = fVar81 * *pfVar2 + *pfVar1;
    auVar105._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
    auVar105._8_4_ = fVar81 * pfVar2[2] + pfVar1[2];
    auVar105._12_4_ = fVar81 * pfVar2[3] + pfVar1[3];
    auVar105 = vsubps_avx(auVar105,auVar218);
    auVar94._0_4_ = fVar4 * auVar105._0_4_;
    auVar94._4_4_ = fVar4 * auVar105._4_4_;
    auVar94._8_4_ = fVar4 * auVar105._8_4_;
    auVar94._12_4_ = fVar4 * auVar105._12_4_;
    pfVar2 = (float *)(uVar79 + 0x80 + uVar74);
    auVar105 = vmaxps_avx(auVar165,auVar94);
    pfVar1 = (float *)(uVar79 + 0x20 + uVar74);
    auVar152._0_4_ = fVar81 * *pfVar2 + *pfVar1;
    auVar152._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
    auVar152._8_4_ = fVar81 * pfVar2[2] + pfVar1[2];
    auVar152._12_4_ = fVar81 * pfVar2[3] + pfVar1[3];
    auVar94 = vsubps_avx(auVar152,auVar227);
    pfVar2 = (float *)(uVar79 + 0x80 + uVar72);
    pfVar1 = (float *)(uVar79 + 0x20 + uVar72);
    auVar198._0_4_ = fVar81 * *pfVar2 + *pfVar1;
    auVar198._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
    auVar198._8_4_ = fVar81 * pfVar2[2] + pfVar1[2];
    auVar198._12_4_ = fVar81 * pfVar2[3] + pfVar1[3];
    auVar184._0_4_ = fVar5 * auVar94._0_4_;
    auVar184._4_4_ = fVar5 * auVar94._4_4_;
    auVar184._8_4_ = fVar5 * auVar94._8_4_;
    auVar184._12_4_ = fVar5 * auVar94._12_4_;
    auVar94 = vsubps_avx(auVar198,auVar232);
    auVar133._0_4_ = fVar6 * auVar94._0_4_;
    auVar133._4_4_ = fVar6 * auVar94._4_4_;
    auVar133._8_4_ = fVar6 * auVar94._8_4_;
    auVar133._12_4_ = fVar6 * auVar94._12_4_;
    auVar94 = vmaxps_avx(auVar184,auVar133);
    pfVar2 = (float *)(uVar79 + 0x80 + (uVar76 ^ 0x10));
    pfVar1 = (float *)(uVar79 + 0x20 + (uVar76 ^ 0x10));
    auVar134._0_4_ = fVar81 * *pfVar2 + *pfVar1;
    auVar134._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
    auVar134._8_4_ = fVar81 * pfVar2[2] + pfVar1[2];
    auVar134._12_4_ = fVar81 * pfVar2[3] + pfVar1[3];
    auVar105 = vmaxps_avx(auVar105,auVar94);
    auVar94 = vsubps_avx(auVar134,auVar218);
    pfVar2 = (float *)(uVar79 + 0x80 + (uVar74 ^ 0x10));
    auVar112._0_4_ = fVar4 * auVar94._0_4_;
    auVar112._4_4_ = fVar4 * auVar94._4_4_;
    auVar112._8_4_ = fVar4 * auVar94._8_4_;
    auVar112._12_4_ = fVar4 * auVar94._12_4_;
    pfVar1 = (float *)(uVar79 + 0x20 + (uVar74 ^ 0x10));
    auVar135._0_4_ = fVar81 * *pfVar2 + *pfVar1;
    auVar135._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
    auVar135._8_4_ = fVar81 * pfVar2[2] + pfVar1[2];
    auVar135._12_4_ = fVar81 * pfVar2[3] + pfVar1[3];
    auVar94 = vsubps_avx(auVar135,auVar227);
    pfVar2 = (float *)(uVar79 + 0x80 + (uVar72 ^ 0x10));
    pfVar1 = (float *)(uVar79 + 0x20 + (uVar72 ^ 0x10));
    auVar142._0_4_ = fVar81 * *pfVar2 + *pfVar1;
    auVar142._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
    auVar142._8_4_ = fVar81 * pfVar2[2] + pfVar1[2];
    auVar142._12_4_ = fVar81 * pfVar2[3] + pfVar1[3];
    auVar136._0_4_ = fVar5 * auVar94._0_4_;
    auVar136._4_4_ = fVar5 * auVar94._4_4_;
    auVar136._8_4_ = fVar5 * auVar94._8_4_;
    auVar136._12_4_ = fVar5 * auVar94._12_4_;
    auVar94 = vsubps_avx(auVar142,auVar232);
    auVar143._0_4_ = fVar6 * auVar94._0_4_;
    auVar143._4_4_ = fVar6 * auVar94._4_4_;
    auVar143._8_4_ = fVar6 * auVar94._8_4_;
    auVar143._12_4_ = fVar6 * auVar94._12_4_;
    auVar94 = vminps_avx(auVar136,auVar143);
    auVar152 = vminps_avx(auVar87._0_16_,auVar112);
    auVar94 = vminps_avx(auVar152,auVar94);
    if (((uint)uVar73 & 7) == 6) {
      auVar152 = vcmpps_avx(auVar105,auVar94,2);
      auVar94 = vcmpps_avx(*(undefined1 (*) [16])(uVar79 + 0xe0),auVar93,2);
      auVar93 = vcmpps_avx(auVar93,*(undefined1 (*) [16])(uVar79 + 0xf0),1);
      auVar94 = vandps_avx(auVar94,auVar93);
      auVar94 = vandps_avx(auVar94,auVar152);
    }
    else {
      auVar94 = vcmpps_avx(auVar105,auVar94,2);
    }
    auVar94 = vpslld_avx(auVar94,0x1f);
    uVar70 = vmovmskps_avx(auVar94);
    local_1240._0_16_ = auVar105;
    if (uVar70 == 0) {
      if (pauVar69 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      goto LAB_00349c68;
    }
    uVar70 = uVar70 & 0xff;
    lVar15 = 0;
    if (uVar70 != 0) {
      for (; (uVar70 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
      }
    }
    uVar73 = *(ulong *)(uVar79 + lVar15 * 8);
    uVar70 = uVar70 - 1 & uVar70;
    if (uVar70 != 0) {
      uVar68 = *(uint *)(local_1240 + lVar15 * 4);
      lVar15 = 0;
      if (uVar70 != 0) {
        for (; (uVar70 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
        }
      }
      uVar10 = *(ulong *)(uVar79 + lVar15 * 8);
      uVar14 = *(uint *)(local_1240 + lVar15 * 4);
      uVar70 = uVar70 - 1 & uVar70;
      if (uVar70 == 0) {
        if (uVar68 < uVar14) {
          *(ulong *)*pauVar69 = uVar10;
          *(uint *)(*pauVar69 + 8) = uVar14;
          pauVar69 = pauVar69 + 1;
        }
        else {
          *(ulong *)*pauVar69 = uVar73;
          *(uint *)(*pauVar69 + 8) = uVar68;
          pauVar69 = pauVar69 + 1;
          uVar73 = uVar10;
        }
      }
      else {
        auVar95._8_8_ = 0;
        auVar95._0_8_ = uVar73;
        auVar105 = vpunpcklqdq_avx(auVar95,ZEXT416(uVar68));
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar10;
        auVar94 = vpunpcklqdq_avx(auVar106,ZEXT416(uVar14));
        lVar15 = 0;
        if (uVar70 != 0) {
          for (; (uVar70 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        auVar113._8_8_ = 0;
        auVar113._0_8_ = *(ulong *)(uVar79 + lVar15 * 8);
        auVar93 = vpunpcklqdq_avx(auVar113,ZEXT416(*(uint *)(local_1240 + lVar15 * 4)));
        auVar152 = vpcmpgtd_avx(auVar94,auVar105);
        uVar70 = uVar70 - 1 & uVar70;
        if (uVar70 == 0) {
          auVar184 = vpshufd_avx(auVar152,0xaa);
          auVar152 = vblendvps_avx(auVar94,auVar105,auVar184);
          auVar105 = vblendvps_avx(auVar105,auVar94,auVar184);
          auVar94 = vpcmpgtd_avx(auVar93,auVar152);
          auVar184 = vpshufd_avx(auVar94,0xaa);
          auVar94 = vblendvps_avx(auVar93,auVar152,auVar184);
          auVar152 = vblendvps_avx(auVar152,auVar93,auVar184);
          auVar93 = vpcmpgtd_avx(auVar152,auVar105);
          auVar184 = vpshufd_avx(auVar93,0xaa);
          auVar93 = vblendvps_avx(auVar152,auVar105,auVar184);
          auVar105 = vblendvps_avx(auVar105,auVar152,auVar184);
          *pauVar69 = auVar105;
          pauVar69[1] = auVar93;
          uVar73 = auVar94._0_8_;
          pauVar69 = pauVar69 + 2;
        }
        else {
          lVar15 = 0;
          if (uVar70 != 0) {
            for (; (uVar70 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          auVar144._8_8_ = 0;
          auVar144._0_8_ = *(ulong *)(uVar79 + lVar15 * 8);
          auVar112 = vpunpcklqdq_avx(auVar144,ZEXT416(*(uint *)(local_1240 + lVar15 * 4)));
          auVar184 = vpshufd_avx(auVar152,0xaa);
          auVar152 = vblendvps_avx(auVar94,auVar105,auVar184);
          auVar105 = vblendvps_avx(auVar105,auVar94,auVar184);
          auVar94 = vpcmpgtd_avx(auVar112,auVar93);
          auVar184 = vpshufd_avx(auVar94,0xaa);
          auVar94 = vblendvps_avx(auVar112,auVar93,auVar184);
          auVar93 = vblendvps_avx(auVar93,auVar112,auVar184);
          auVar184 = vpcmpgtd_avx(auVar93,auVar105);
          auVar112 = vpshufd_avx(auVar184,0xaa);
          auVar184 = vblendvps_avx(auVar93,auVar105,auVar112);
          auVar105 = vblendvps_avx(auVar105,auVar93,auVar112);
          auVar93 = vpcmpgtd_avx(auVar94,auVar152);
          auVar112 = vpshufd_avx(auVar93,0xaa);
          auVar93 = vblendvps_avx(auVar94,auVar152,auVar112);
          auVar94 = vblendvps_avx(auVar152,auVar94,auVar112);
          auVar152 = vpcmpgtd_avx(auVar184,auVar94);
          auVar112 = vpshufd_avx(auVar152,0xaa);
          auVar152 = vblendvps_avx(auVar184,auVar94,auVar112);
          auVar94 = vblendvps_avx(auVar94,auVar184,auVar112);
          *pauVar69 = auVar105;
          pauVar69[1] = auVar94;
          pauVar69[2] = auVar152;
          uVar73 = auVar93._0_8_;
          pauVar69 = pauVar69 + 3;
        }
      }
    }
  }
  if (((uint)uVar73 & 0xf) != 8) {
    sVar13 = ((*(GridSOA **)(uVar73 & 0xfffffffffffffff0))->troot).ptr;
    (pre->super_Precalculations).grid = *(GridSOA **)(uVar73 & 0xfffffffffffffff0);
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar87 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    if (sVar13 != 0) {
      *(size_t *)*pauVar69 = sVar13;
      *(undefined4 *)(*pauVar69 + 8) = 0;
      pauVar69 = pauVar69 + 1;
    }
    goto LAB_0034ab68;
  }
  pGVar11 = (pre->super_Precalculations).grid;
  fVar80 = (float)(pGVar11->time_steps - 1);
  fVar81 = fVar80 * *(float *)(ray + k * 4 + 0x70);
  uVar70 = pGVar11->width;
  local_13d0 = (ulong)uVar70;
  auVar105 = vroundss_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),9);
  auVar105 = vminss_avx(auVar105,ZEXT416((uint)(fVar80 + -1.0)));
  auVar152 = vmaxss_avx(ZEXT816(0) << 0x20,auVar105);
  uVar68 = pGVar11->height;
  local_13c8 = (ulong)uVar68;
  lVar15 = (long)(int)auVar152._0_4_ * (ulong)pGVar11->gridBytes + (ulong)pGVar11->gridOffset;
  uVar73 = uVar73 >> 4;
  lVar66 = uVar73 * 4 + lVar15;
  lVar67 = uVar73 * 4 + lVar15 + 0x2c;
  auVar105 = *(undefined1 (*) [16])(pGVar11->data + local_13d0 * 4 + lVar66 + -4);
  auVar94 = auVar105;
  if (2 < local_13c8) {
    auVar94 = *(undefined1 (*) [16])(pGVar11->data + local_13d0 * 8 + lVar67 + -0x30);
  }
  _local_1460 = *(undefined1 (*) [16])(pGVar11->data + uVar73 * 4 + lVar15 + -4);
  if (local_13d0 == 2) {
    _local_1460 = vshufps_avx(_local_1460,_local_1460,0x54);
    auVar105 = vshufps_avx(auVar105,auVar105,0x54);
    auVar94 = vshufps_avx(auVar94,auVar94,0x54);
  }
  uVar73 = (ulong)pGVar11->dim_offset;
  pcVar75 = pGVar11->data + uVar73 * 4 + lVar66 + -4;
  auVar93 = *(undefined1 (*) [16])(pcVar75 + local_13d0 * 4);
  auVar184 = auVar93;
  if (2 < uVar68) {
    auVar184 = *(undefined1 (*) [16])(pcVar75 + local_13d0 * 8);
  }
  _local_14a0 = *(undefined1 (*) [16])pcVar75;
  if (uVar70 == 2) {
    _local_14a0 = vshufps_avx(_local_14a0,_local_14a0,0x54);
    auVar93 = vshufps_avx(auVar93,auVar93,0x54);
    auVar184 = vshufps_avx(auVar184,auVar184,0x54);
  }
  pcVar77 = pGVar11->data + uVar73 * 8 + lVar66 + -4;
  _local_13a0 = *(undefined1 (*) [16])(pcVar77 + local_13d0 * 4);
  auVar112 = _local_13a0;
  if (2 < uVar68) {
    auVar112 = *(undefined1 (*) [16])(pcVar77 + local_13d0 * 8);
  }
  auVar198 = *(undefined1 (*) [16])pcVar77;
  if (uVar70 == 2) {
    auVar198 = vshufps_avx(auVar198,auVar198,0x54);
    _local_13a0 = vshufps_avx(_local_13a0,_local_13a0,0x54);
    auVar112 = vshufps_avx(auVar112,auVar112,0x54);
  }
  uVar79 = (ulong)(pGVar11->gridBytes & 0xfffffffc);
  auVar133 = *(undefined1 (*) [16])(pGVar11->data + local_13d0 * 4 + uVar79 + lVar67 + -0x30);
  auVar134 = auVar133;
  if (2 < uVar68) {
    auVar134 = *(undefined1 (*) [16])(pGVar11->data + local_13d0 * 8 + uVar79 + lVar67 + -0x30);
  }
  auVar135 = *(undefined1 (*) [16])(pGVar11->data + uVar79 + lVar67 + -0x30);
  if (uVar70 == 2) {
    auVar135 = vshufps_avx(auVar135,auVar135,0x54);
    auVar133 = vshufps_avx(auVar133,auVar133,0x54);
    auVar134 = vshufps_avx(auVar134,auVar134,0x54);
  }
  pcVar75 = pcVar75 + uVar79;
  auVar136 = *(undefined1 (*) [16])(pcVar75 + local_13d0 * 4);
  auVar142 = auVar136;
  if (2 < uVar68) {
    auVar142 = *(undefined1 (*) [16])(pcVar75 + local_13d0 * 8);
  }
  local_12c0._0_16_ = *(undefined1 (*) [16])pcVar75;
  if (uVar70 == 2) {
    local_12c0._0_16_ = vshufps_avx(local_12c0._0_16_,local_12c0._0_16_,0x54);
    auVar136 = vshufps_avx(auVar136,auVar136,0x54);
    auVar142 = vshufps_avx(auVar142,auVar142,0x54);
  }
  pcVar77 = pcVar77 + uVar79;
  auVar143 = *(undefined1 (*) [16])pcVar77;
  auVar95 = *(undefined1 (*) [16])(pcVar77 + local_13d0 * 4);
  auVar106 = auVar95;
  if (2 < uVar68) {
    auVar106 = *(undefined1 (*) [16])(pcVar77 + local_13d0 * 8);
  }
  fVar81 = fVar81 - auVar152._0_4_;
  auVar137._16_16_ = auVar105;
  auVar137._0_16_ = _local_1460;
  auVar107._16_16_ = auVar94;
  auVar107._0_16_ = auVar105;
  auVar30 = vunpcklps_avx(auVar137,auVar107);
  auVar137 = vshufps_avx(auVar137,auVar137,0xa5);
  auVar107 = vshufps_avx(auVar107,auVar107,0x94);
  auVar115._16_16_ = auVar93;
  auVar115._0_16_ = _local_14a0;
  auVar145._16_16_ = auVar184;
  auVar145._0_16_ = auVar93;
  auVar31 = vunpcklps_avx(auVar115,auVar145);
  auVar115 = vshufps_avx(auVar115,auVar115,0xa5);
  auVar145 = vshufps_avx(auVar145,auVar145,0x94);
  auVar116._16_16_ = _local_13a0;
  auVar116._0_16_ = auVar198;
  auVar147._16_16_ = auVar112;
  auVar147._0_16_ = _local_13a0;
  auVar32 = vunpcklps_avx(auVar116,auVar147);
  auVar116 = vshufps_avx(auVar116,auVar116,0xa5);
  auVar147 = vshufps_avx(auVar147,auVar147,0x94);
  auVar148._16_16_ = auVar133;
  auVar148._0_16_ = auVar135;
  auVar200._16_16_ = auVar134;
  auVar200._0_16_ = auVar133;
  auVar33 = vunpcklps_avx(auVar148,auVar200);
  auVar148 = vshufps_avx(auVar148,auVar148,0xa5);
  auVar200 = vshufps_avx(auVar200,auVar200,0x94);
  auVar166._16_16_ = auVar136;
  auVar166._0_16_ = local_12c0._0_16_;
  auVar246._16_16_ = auVar142;
  auVar246._0_16_ = auVar136;
  auVar34 = vunpcklps_avx(auVar166,auVar246);
  auVar166 = vshufps_avx(auVar166,auVar166,0xa5);
  auVar246 = vshufps_avx(auVar246,auVar246,0x94);
  if (uVar70 == 2) {
    auVar143 = vshufps_avx(auVar143,auVar143,0x54);
    auVar95 = vshufps_avx(auVar95,auVar95,0x54);
    auVar106 = vshufps_avx(auVar106,auVar106,0x54);
  }
  auVar247._16_16_ = auVar95;
  auVar247._0_16_ = auVar143;
  auVar138._16_16_ = auVar106;
  auVar138._0_16_ = auVar95;
  auVar105 = vshufps_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),0);
  auVar94 = vshufps_avx(ZEXT416((uint)(1.0 - fVar81)),ZEXT416((uint)(1.0 - fVar81)),0);
  fVar226 = auVar105._0_4_;
  fVar229 = auVar105._4_4_;
  fVar121 = auVar105._8_4_;
  fVar123 = auVar105._12_4_;
  local_13c0._0_4_ = auVar30._0_4_;
  local_13c0._4_4_ = auVar30._4_4_;
  auStack_13b8._0_4_ = auVar30._8_4_;
  auStack_13b8._4_4_ = auVar30._12_4_;
  fStack_13b0 = auVar30._16_4_;
  fStack_13ac = auVar30._20_4_;
  fStack_13a8 = auVar30._24_4_;
  fVar80 = auVar94._0_4_;
  fVar155 = auVar94._4_4_;
  fVar156 = auVar94._8_4_;
  fVar157 = auVar94._12_4_;
  auVar82._0_4_ = fVar80 * (float)local_13c0 + fVar226 * auVar33._0_4_;
  auVar82._4_4_ = fVar155 * local_13c0._4_4_ + fVar229 * auVar33._4_4_;
  auVar82._8_4_ = fVar156 * (float)auStack_13b8._0_4_ + fVar121 * auVar33._8_4_;
  auVar82._12_4_ = fVar157 * (float)auStack_13b8._4_4_ + fVar123 * auVar33._12_4_;
  auVar82._16_4_ = fVar80 * fStack_13b0 + fVar226 * auVar33._16_4_;
  auVar82._20_4_ = fVar155 * fStack_13ac + fVar229 * auVar33._20_4_;
  auVar82._24_4_ = fVar156 * fStack_13a8 + fVar121 * auVar33._24_4_;
  auVar82._28_4_ = 0;
  auVar83._0_4_ = fVar80 * auVar31._0_4_ + fVar226 * auVar34._0_4_;
  auVar83._4_4_ = fVar155 * auVar31._4_4_ + fVar229 * auVar34._4_4_;
  auVar83._8_4_ = fVar156 * auVar31._8_4_ + fVar121 * auVar34._8_4_;
  auVar83._12_4_ = fVar157 * auVar31._12_4_ + fVar123 * auVar34._12_4_;
  auVar83._16_4_ = fVar80 * auVar31._16_4_ + fVar226 * auVar34._16_4_;
  auVar83._20_4_ = fVar155 * auVar31._20_4_ + fVar229 * auVar34._20_4_;
  auVar83._24_4_ = fVar156 * auVar31._24_4_ + fVar121 * auVar34._24_4_;
  auVar83._28_4_ = auVar31._28_4_ + 0.0;
  auVar30 = vunpcklps_avx(auVar247,auVar138);
  local_12a0._0_4_ = auVar32._0_4_;
  local_12a0._4_4_ = auVar32._4_4_;
  fStack_1298 = auVar32._8_4_;
  fStack_1294 = auVar32._12_4_;
  fStack_1290 = auVar32._16_4_;
  fStack_128c = auVar32._20_4_;
  fStack_1288 = auVar32._24_4_;
  auVar97._0_4_ = fVar80 * (float)local_12a0._0_4_ + fVar226 * auVar30._0_4_;
  auVar97._4_4_ = fVar155 * (float)local_12a0._4_4_ + fVar229 * auVar30._4_4_;
  auVar97._8_4_ = fVar156 * fStack_1298 + fVar121 * auVar30._8_4_;
  auVar97._12_4_ = fVar157 * fStack_1294 + fVar123 * auVar30._12_4_;
  auVar97._16_4_ = fVar80 * fStack_1290 + fVar226 * auVar30._16_4_;
  auVar97._20_4_ = fVar155 * fStack_128c + fVar229 * auVar30._20_4_;
  auVar97._24_4_ = fVar156 * fStack_1288 + fVar121 * auVar30._24_4_;
  auVar97._28_4_ = auVar33._28_4_ + auVar30._28_4_;
  local_12e0._0_4_ = auVar137._0_4_;
  local_12e0._4_4_ = auVar137._4_4_;
  uStack_12d8._0_4_ = auVar137._8_4_;
  uStack_12d8._4_4_ = auVar137._12_4_;
  auStack_12d0._0_4_ = auVar137._16_4_;
  auStack_12d0._4_4_ = auVar137._20_4_;
  fStack_12c8 = auVar137._24_4_;
  auVar159._0_4_ = fVar80 * (float)local_12e0._0_4_ + fVar226 * auVar148._0_4_;
  auVar159._4_4_ = fVar155 * (float)local_12e0._4_4_ + fVar229 * auVar148._4_4_;
  auVar159._8_4_ = fVar156 * (float)uStack_12d8 + fVar121 * auVar148._8_4_;
  auVar159._12_4_ = fVar157 * uStack_12d8._4_4_ + fVar123 * auVar148._12_4_;
  auVar159._16_4_ = fVar80 * (float)auStack_12d0._0_4_ + fVar226 * auVar148._16_4_;
  auVar159._20_4_ = fVar155 * (float)auStack_12d0._4_4_ + fVar229 * auVar148._20_4_;
  auVar159._24_4_ = fVar156 * fStack_12c8 + fVar121 * auVar148._24_4_;
  auVar159._28_4_ = auVar33._28_4_ + 0.0;
  local_13d8 = pGVar11->data + uVar73 * 0xc + lVar66 + -4;
  auVar137 = vshufps_avx(auVar247,auVar247,0xa5);
  auVar30 = vshufps_avx(auVar138,auVar138,0x94);
  fVar81 = auVar137._28_4_;
  local_1360._0_4_ = auVar115._0_4_;
  local_1360._4_4_ = auVar115._4_4_;
  fStack_1358 = auVar115._8_4_;
  fStack_1354 = auVar115._12_4_;
  fStack_1350 = auVar115._16_4_;
  fStack_134c = auVar115._20_4_;
  fStack_1348 = auVar115._24_4_;
  auVar185._0_4_ = fVar80 * (float)local_1360._0_4_ + fVar226 * auVar166._0_4_;
  auVar185._4_4_ = fVar155 * (float)local_1360._4_4_ + fVar229 * auVar166._4_4_;
  auVar185._8_4_ = fVar156 * fStack_1358 + fVar121 * auVar166._8_4_;
  auVar185._12_4_ = fVar157 * fStack_1354 + fVar123 * auVar166._12_4_;
  auVar185._16_4_ = fVar80 * fStack_1350 + fVar226 * auVar166._16_4_;
  auVar185._20_4_ = fVar155 * fStack_134c + fVar229 * auVar166._20_4_;
  auVar185._24_4_ = fVar156 * fStack_1348 + fVar121 * auVar166._24_4_;
  auVar185._28_4_ = auVar166._28_4_ + auVar147._28_4_;
  local_1280._0_4_ = auVar116._0_4_;
  local_1280._4_4_ = auVar116._4_4_;
  fStack_1278 = auVar116._8_4_;
  fStack_1274 = auVar116._12_4_;
  fStack_1270 = auVar116._16_4_;
  fStack_126c = auVar116._20_4_;
  fStack_1268 = auVar116._24_4_;
  auVar201._0_4_ = fVar80 * (float)local_1280._0_4_ + fVar226 * auVar137._0_4_;
  auVar201._4_4_ = fVar155 * (float)local_1280._4_4_ + fVar229 * auVar137._4_4_;
  auVar201._8_4_ = fVar156 * fStack_1278 + fVar121 * auVar137._8_4_;
  auVar201._12_4_ = fVar157 * fStack_1274 + fVar123 * auVar137._12_4_;
  auVar201._16_4_ = fVar80 * fStack_1270 + fVar226 * auVar137._16_4_;
  auVar201._20_4_ = fVar155 * fStack_126c + fVar229 * auVar137._20_4_;
  auVar201._24_4_ = fVar156 * fStack_1268 + fVar121 * auVar137._24_4_;
  auVar201._28_4_ = auVar148._28_4_ + fVar81;
  local_13a0._0_4_ = auVar200._0_4_;
  local_13a0._4_4_ = auVar200._4_4_;
  fStack_1398 = auVar200._8_4_;
  fStack_1394 = auVar200._12_4_;
  auStack_1390._0_4_ = auVar200._16_4_;
  auStack_1390._4_4_ = auVar200._20_4_;
  fStack_1388 = auVar200._24_4_;
  auVar167._0_4_ = fVar80 * auVar107._0_4_ + fVar226 * (float)local_13a0._0_4_;
  auVar167._4_4_ = fVar155 * auVar107._4_4_ + fVar229 * (float)local_13a0._4_4_;
  auVar167._8_4_ = fVar156 * auVar107._8_4_ + fVar121 * fStack_1398;
  auVar167._12_4_ = fVar157 * auVar107._12_4_ + fVar123 * fStack_1394;
  auVar167._16_4_ = fVar80 * auVar107._16_4_ + fVar226 * (float)auStack_1390._0_4_;
  auVar167._20_4_ = fVar155 * auVar107._20_4_ + fVar229 * (float)auStack_1390._4_4_;
  auVar167._24_4_ = fVar156 * auVar107._24_4_ + fVar121 * fStack_1388;
  auVar167._28_4_ = auVar107._28_4_ + fVar81;
  local_1460._0_4_ = auVar145._0_4_;
  local_1460._4_4_ = auVar145._4_4_;
  uStack_1458._0_4_ = auVar145._8_4_;
  uStack_1458._4_4_ = auVar145._12_4_;
  uStack_1450._0_4_ = auVar145._16_4_;
  uStack_1450._4_4_ = auVar145._20_4_;
  uStack_1448._0_4_ = auVar145._24_4_;
  auVar219._0_4_ = fVar80 * (float)local_1460._0_4_ + fVar226 * auVar246._0_4_;
  auVar219._4_4_ = fVar155 * (float)local_1460._4_4_ + fVar229 * auVar246._4_4_;
  auVar219._8_4_ = fVar156 * (float)uStack_1458 + fVar121 * auVar246._8_4_;
  auVar219._12_4_ = fVar157 * uStack_1458._4_4_ + fVar123 * auVar246._12_4_;
  auVar219._16_4_ = fVar80 * (float)uStack_1450 + fVar226 * auVar246._16_4_;
  auVar219._20_4_ = fVar155 * uStack_1450._4_4_ + fVar229 * auVar246._20_4_;
  auVar219._24_4_ = fVar156 * (float)uStack_1448 + fVar121 * auVar246._24_4_;
  auVar219._28_4_ = fVar81 + auVar148._28_4_;
  local_14a0._0_4_ = auVar147._0_4_;
  local_14a0._4_4_ = auVar147._4_4_;
  fStack_1498 = auVar147._8_4_;
  fStack_1494 = auVar147._12_4_;
  fStack_1490 = auVar147._16_4_;
  fStack_148c = auVar147._20_4_;
  fStack_1488 = auVar147._24_4_;
  uVar3 = *(undefined4 *)(ray + k * 4);
  auVar153._4_4_ = uVar3;
  auVar153._0_4_ = uVar3;
  auVar153._8_4_ = uVar3;
  auVar153._12_4_ = uVar3;
  auVar153._16_4_ = uVar3;
  auVar153._20_4_ = uVar3;
  auVar153._24_4_ = uVar3;
  auVar153._28_4_ = uVar3;
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar228._4_4_ = uVar3;
  auVar228._0_4_ = uVar3;
  auVar228._8_4_ = uVar3;
  auVar228._12_4_ = uVar3;
  auVar228._16_4_ = uVar3;
  auVar228._20_4_ = uVar3;
  auVar228._24_4_ = uVar3;
  auVar228._28_4_ = uVar3;
  auVar233._0_4_ = fVar80 * (float)local_14a0._0_4_ + fVar226 * auVar30._0_4_;
  auVar233._4_4_ = fVar155 * (float)local_14a0._4_4_ + fVar229 * auVar30._4_4_;
  auVar233._8_4_ = fVar156 * fStack_1498 + fVar121 * auVar30._8_4_;
  auVar233._12_4_ = fVar157 * fStack_1494 + fVar123 * auVar30._12_4_;
  auVar233._16_4_ = fVar80 * fStack_1490 + fVar226 * auVar30._16_4_;
  auVar233._20_4_ = fVar155 * fStack_148c + fVar229 * auVar30._20_4_;
  auVar233._24_4_ = fVar156 * fStack_1488 + fVar121 * auVar30._24_4_;
  auVar233._28_4_ = fVar81 + auVar30._28_4_;
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar248._4_4_ = uVar3;
  auVar248._0_4_ = uVar3;
  auVar248._8_4_ = uVar3;
  auVar248._12_4_ = uVar3;
  auVar248._16_4_ = uVar3;
  auVar248._20_4_ = uVar3;
  auVar248._24_4_ = uVar3;
  auVar248._28_4_ = uVar3;
  auVar145 = vsubps_avx(auVar82,auVar153);
  auVar116 = vsubps_avx(auVar83,auVar228);
  auVar147 = vsubps_avx(auVar97,auVar248);
  auVar137 = vsubps_avx(auVar159,auVar153);
  auVar107 = vsubps_avx(auVar185,auVar228);
  auVar115 = vsubps_avx(auVar201,auVar248);
  auVar148 = vsubps_avx(auVar167,auVar153);
  auVar200 = vsubps_avx(auVar219,auVar228);
  auVar166 = vsubps_avx(auVar233,auVar248);
  _local_1280 = vsubps_avx(auVar148,auVar145);
  local_12c0 = vsubps_avx(auVar200,auVar116);
  _local_12a0 = vsubps_avx(auVar166,auVar147);
  fVar155 = auVar116._0_4_;
  fVar81 = auVar200._0_4_ + fVar155;
  fVar226 = auVar116._4_4_;
  fVar80 = auVar200._4_4_ + fVar226;
  fVar123 = auVar116._8_4_;
  fVar88 = auVar200._8_4_ + fVar123;
  fVar129 = auVar116._12_4_;
  fVar89 = auVar200._12_4_ + fVar129;
  fVar17 = auVar116._16_4_;
  fVar90 = auVar200._16_4_ + fVar17;
  fVar20 = auVar116._20_4_;
  fVar91 = auVar200._20_4_ + fVar20;
  fVar23 = auVar116._24_4_;
  fVar92 = auVar200._24_4_ + fVar23;
  fVar156 = auVar147._0_4_;
  fVar162 = auVar166._0_4_ + fVar156;
  fVar229 = auVar147._4_4_;
  fVar171 = auVar166._4_4_ + fVar229;
  fVar125 = auVar147._8_4_;
  fVar173 = auVar166._8_4_ + fVar125;
  fVar131 = auVar147._12_4_;
  fVar175 = auVar166._12_4_ + fVar131;
  fVar18 = auVar147._16_4_;
  fVar177 = auVar166._16_4_ + fVar18;
  fVar21 = auVar147._20_4_;
  fVar179 = auVar166._20_4_ + fVar21;
  fVar24 = auVar147._24_4_;
  fVar181 = auVar166._24_4_ + fVar24;
  fVar163 = auVar147._28_4_;
  fVar102 = local_12a0._0_4_;
  fVar103 = local_12a0._4_4_;
  auVar30._4_4_ = fVar80 * fVar103;
  auVar30._0_4_ = fVar81 * fVar102;
  fVar104 = local_12a0._8_4_;
  auVar30._8_4_ = fVar88 * fVar104;
  fVar26 = local_12a0._12_4_;
  auVar30._12_4_ = fVar89 * fVar26;
  fVar27 = local_12a0._16_4_;
  auVar30._16_4_ = fVar90 * fVar27;
  fVar28 = local_12a0._20_4_;
  auVar30._20_4_ = fVar91 * fVar28;
  fVar29 = local_12a0._24_4_;
  auVar30._24_4_ = fVar92 * fVar29;
  auVar30._28_4_ = auVar185._28_4_;
  fVar230 = local_12c0._0_4_;
  fVar234 = local_12c0._4_4_;
  auVar31._4_4_ = fVar234 * fVar171;
  auVar31._0_4_ = fVar230 * fVar162;
  fVar236 = local_12c0._8_4_;
  auVar31._8_4_ = fVar236 * fVar173;
  fVar238 = local_12c0._12_4_;
  auVar31._12_4_ = fVar238 * fVar175;
  fVar240 = local_12c0._16_4_;
  auVar31._16_4_ = fVar240 * fVar177;
  fVar242 = local_12c0._20_4_;
  auVar31._20_4_ = fVar242 * fVar179;
  fVar244 = local_12c0._24_4_;
  auVar31._24_4_ = fVar244 * fVar181;
  auVar31._28_4_ = auVar219._28_4_;
  auVar246 = vsubps_avx(auVar31,auVar30);
  fVar157 = auVar145._0_4_;
  fVar183 = auVar148._0_4_ + fVar157;
  fVar121 = auVar145._4_4_;
  fVar188 = auVar148._4_4_ + fVar121;
  fVar127 = auVar145._8_4_;
  fVar189 = auVar148._8_4_ + fVar127;
  fVar16 = auVar145._12_4_;
  fVar190 = auVar148._12_4_ + fVar16;
  fVar19 = auVar145._16_4_;
  fVar191 = auVar148._16_4_ + fVar19;
  fVar22 = auVar145._20_4_;
  fVar192 = auVar148._20_4_ + fVar22;
  fVar25 = auVar145._24_4_;
  fVar193 = auVar148._24_4_ + fVar25;
  fVar158 = auVar148._28_4_;
  fVar194 = local_1280._0_4_;
  fVar204 = local_1280._4_4_;
  auVar32._4_4_ = fVar204 * fVar171;
  auVar32._0_4_ = fVar194 * fVar162;
  fVar207 = local_1280._8_4_;
  auVar32._8_4_ = fVar207 * fVar173;
  fVar209 = local_1280._12_4_;
  auVar32._12_4_ = fVar209 * fVar175;
  fVar211 = local_1280._16_4_;
  auVar32._16_4_ = fVar211 * fVar177;
  fVar213 = local_1280._20_4_;
  auVar32._20_4_ = fVar213 * fVar179;
  fVar215 = local_1280._24_4_;
  auVar32._24_4_ = fVar215 * fVar181;
  auVar32._28_4_ = auVar166._28_4_ + fVar163;
  auVar33._4_4_ = fVar188 * fVar103;
  auVar33._0_4_ = fVar183 * fVar102;
  auVar33._8_4_ = fVar189 * fVar104;
  auVar33._12_4_ = fVar190 * fVar26;
  auVar33._16_4_ = fVar191 * fVar27;
  auVar33._20_4_ = fVar192 * fVar28;
  auVar33._24_4_ = fVar193 * fVar29;
  auVar33._28_4_ = auVar219._28_4_;
  auVar30 = vsubps_avx(auVar33,auVar32);
  auVar34._4_4_ = fVar188 * fVar234;
  auVar34._0_4_ = fVar183 * fVar230;
  auVar34._8_4_ = fVar189 * fVar236;
  auVar34._12_4_ = fVar190 * fVar238;
  auVar34._16_4_ = fVar191 * fVar240;
  auVar34._20_4_ = fVar192 * fVar242;
  auVar34._24_4_ = fVar193 * fVar244;
  auVar34._28_4_ = fVar158 + auVar145._28_4_;
  auVar35._4_4_ = fVar204 * fVar80;
  auVar35._0_4_ = fVar194 * fVar81;
  auVar35._8_4_ = fVar207 * fVar88;
  auVar35._12_4_ = fVar209 * fVar89;
  auVar35._16_4_ = fVar211 * fVar90;
  auVar35._20_4_ = fVar213 * fVar91;
  auVar35._24_4_ = fVar215 * fVar92;
  auVar35._28_4_ = auVar200._28_4_ + auVar116._28_4_;
  fVar81 = *(float *)(ray + k * 4 + 0x60);
  auVar31 = vsubps_avx(auVar35,auVar34);
  local_1360._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
  fVar80 = *(float *)(ray + k * 4 + 0x40);
  local_1020._0_4_ =
       auVar246._0_4_ * fVar80 + (float)local_1360._4_4_ * auVar30._0_4_ + auVar31._0_4_ * fVar81;
  local_1020._4_4_ =
       auVar246._4_4_ * fVar80 + (float)local_1360._4_4_ * auVar30._4_4_ + auVar31._4_4_ * fVar81;
  local_1020._8_4_ =
       auVar246._8_4_ * fVar80 + (float)local_1360._4_4_ * auVar30._8_4_ + auVar31._8_4_ * fVar81;
  local_1020._12_4_ =
       auVar246._12_4_ * fVar80 + (float)local_1360._4_4_ * auVar30._12_4_ + auVar31._12_4_ * fVar81
  ;
  local_1020._16_4_ =
       auVar246._16_4_ * fVar80 + (float)local_1360._4_4_ * auVar30._16_4_ + auVar31._16_4_ * fVar81
  ;
  local_1020._20_4_ =
       auVar246._20_4_ * fVar80 + (float)local_1360._4_4_ * auVar30._20_4_ + auVar31._20_4_ * fVar81
  ;
  local_1020._24_4_ =
       auVar246._24_4_ * fVar80 + (float)local_1360._4_4_ * auVar30._24_4_ + auVar31._24_4_ * fVar81
  ;
  local_1020._28_4_ = auVar246._28_4_ + auVar30._28_4_ + auVar31._28_4_;
  local_fc0 = vsubps_avx(auVar116,auVar107);
  local_fe0 = vsubps_avx(auVar147,auVar115);
  fVar89 = auVar107._0_4_ + fVar155;
  fVar90 = auVar107._4_4_ + fVar226;
  fVar91 = auVar107._8_4_ + fVar123;
  fVar92 = auVar107._12_4_ + fVar129;
  fVar162 = auVar107._16_4_ + fVar17;
  fVar171 = auVar107._20_4_ + fVar20;
  fVar173 = auVar107._24_4_ + fVar23;
  fVar175 = fVar156 + auVar115._0_4_;
  fVar177 = fVar229 + auVar115._4_4_;
  fVar179 = fVar125 + auVar115._8_4_;
  fVar181 = fVar131 + auVar115._12_4_;
  fVar183 = fVar18 + auVar115._16_4_;
  fVar188 = fVar21 + auVar115._20_4_;
  fVar189 = fVar24 + auVar115._24_4_;
  fVar88 = auVar115._28_4_;
  fVar195 = local_fe0._0_4_;
  fVar205 = local_fe0._4_4_;
  auVar36._4_4_ = fVar205 * fVar90;
  auVar36._0_4_ = fVar195 * fVar89;
  fVar208 = local_fe0._8_4_;
  auVar36._8_4_ = fVar208 * fVar91;
  fVar210 = local_fe0._12_4_;
  auVar36._12_4_ = fVar210 * fVar92;
  fVar212 = local_fe0._16_4_;
  auVar36._16_4_ = fVar212 * fVar162;
  fVar214 = local_fe0._20_4_;
  auVar36._20_4_ = fVar214 * fVar171;
  fVar216 = local_fe0._24_4_;
  auVar36._24_4_ = fVar216 * fVar173;
  auVar36._28_4_ = local_12c0._28_4_;
  fVar217 = local_fc0._0_4_;
  fVar220 = local_fc0._4_4_;
  auVar37._4_4_ = fVar220 * fVar177;
  auVar37._0_4_ = fVar217 * fVar175;
  fVar221 = local_fc0._8_4_;
  auVar37._8_4_ = fVar221 * fVar179;
  fVar222 = local_fc0._12_4_;
  auVar37._12_4_ = fVar222 * fVar181;
  fVar223 = local_fc0._16_4_;
  auVar37._16_4_ = fVar223 * fVar183;
  fVar224 = local_fc0._20_4_;
  auVar37._20_4_ = fVar224 * fVar188;
  fVar225 = local_fc0._24_4_;
  auVar37._24_4_ = fVar225 * fVar189;
  auVar37._28_4_ = fVar163;
  auVar246 = vsubps_avx(auVar37,auVar36);
  auVar30 = vsubps_avx(auVar145,auVar137);
  fVar231 = auVar30._0_4_;
  fVar235 = auVar30._4_4_;
  auVar38._4_4_ = fVar235 * fVar177;
  auVar38._0_4_ = fVar231 * fVar175;
  fVar237 = auVar30._8_4_;
  auVar38._8_4_ = fVar237 * fVar179;
  fVar239 = auVar30._12_4_;
  auVar38._12_4_ = fVar239 * fVar181;
  fVar241 = auVar30._16_4_;
  auVar38._16_4_ = fVar241 * fVar183;
  fVar243 = auVar30._20_4_;
  auVar38._20_4_ = fVar243 * fVar188;
  fVar245 = auVar30._24_4_;
  auVar38._24_4_ = fVar245 * fVar189;
  auVar38._28_4_ = fVar163 + fVar88;
  fVar163 = fVar157 + auVar137._0_4_;
  fVar175 = fVar121 + auVar137._4_4_;
  fVar177 = fVar127 + auVar137._8_4_;
  fVar179 = fVar16 + auVar137._12_4_;
  fVar181 = fVar19 + auVar137._16_4_;
  fVar183 = fVar22 + auVar137._20_4_;
  fVar188 = fVar25 + auVar137._24_4_;
  auVar39._4_4_ = fVar175 * fVar205;
  auVar39._0_4_ = fVar163 * fVar195;
  auVar39._8_4_ = fVar177 * fVar208;
  auVar39._12_4_ = fVar179 * fVar210;
  auVar39._16_4_ = fVar181 * fVar212;
  auVar39._20_4_ = fVar183 * fVar214;
  auVar39._24_4_ = fVar188 * fVar216;
  auVar39._28_4_ = local_fe0._28_4_;
  auVar30 = vsubps_avx(auVar39,auVar38);
  auVar40._4_4_ = fVar175 * fVar220;
  auVar40._0_4_ = fVar163 * fVar217;
  auVar40._8_4_ = fVar177 * fVar221;
  auVar40._12_4_ = fVar179 * fVar222;
  auVar40._16_4_ = fVar181 * fVar223;
  auVar40._20_4_ = fVar183 * fVar224;
  auVar40._24_4_ = fVar188 * fVar225;
  auVar40._28_4_ = auVar145._28_4_ + auVar137._28_4_;
  auVar41._4_4_ = fVar235 * fVar90;
  auVar41._0_4_ = fVar231 * fVar89;
  auVar41._8_4_ = fVar237 * fVar91;
  auVar41._12_4_ = fVar239 * fVar92;
  auVar41._16_4_ = fVar241 * fVar162;
  auVar41._20_4_ = fVar243 * fVar171;
  auVar41._24_4_ = fVar245 * fVar173;
  auVar41._28_4_ = auVar107._28_4_ + auVar116._28_4_;
  auVar31 = vsubps_avx(auVar41,auVar40);
  fVar196 = fVar80 * auVar246._0_4_ +
            auVar31._0_4_ * fVar81 + (float)local_1360._4_4_ * auVar30._0_4_;
  fVar206 = fVar80 * auVar246._4_4_ +
            auVar31._4_4_ * fVar81 + (float)local_1360._4_4_ * auVar30._4_4_;
  auVar197._0_8_ = CONCAT44(fVar206,fVar196);
  auVar197._8_4_ =
       fVar80 * auVar246._8_4_ + auVar31._8_4_ * fVar81 + (float)local_1360._4_4_ * auVar30._8_4_;
  auVar197._12_4_ =
       fVar80 * auVar246._12_4_ + auVar31._12_4_ * fVar81 + (float)local_1360._4_4_ * auVar30._12_4_
  ;
  auVar199._16_4_ =
       fVar80 * auVar246._16_4_ + auVar31._16_4_ * fVar81 + (float)local_1360._4_4_ * auVar30._16_4_
  ;
  auVar199._0_16_ = auVar197;
  auVar199._20_4_ =
       fVar80 * auVar246._20_4_ + auVar31._20_4_ * fVar81 + (float)local_1360._4_4_ * auVar30._20_4_
  ;
  auVar202._24_4_ =
       fVar80 * auVar246._24_4_ + auVar31._24_4_ * fVar81 + (float)local_1360._4_4_ * auVar30._24_4_
  ;
  auVar202._0_24_ = auVar199;
  auVar202._28_4_ = auVar30._28_4_ + auVar31._28_4_ + auVar30._28_4_;
  auVar246 = vsubps_avx(auVar137,auVar148);
  fVar189 = auVar137._0_4_ + auVar148._0_4_;
  fVar190 = auVar137._4_4_ + auVar148._4_4_;
  fVar191 = auVar137._8_4_ + auVar148._8_4_;
  fVar192 = auVar137._12_4_ + auVar148._12_4_;
  fVar193 = auVar137._16_4_ + auVar148._16_4_;
  fVar109 = auVar137._20_4_ + auVar148._20_4_;
  fVar110 = auVar137._24_4_ + auVar148._24_4_;
  auVar148 = vsubps_avx(auVar107,auVar200);
  fVar111 = auVar107._0_4_ + auVar200._0_4_;
  fVar120 = auVar107._4_4_ + auVar200._4_4_;
  fVar122 = auVar107._8_4_ + auVar200._8_4_;
  fVar124 = auVar107._12_4_ + auVar200._12_4_;
  fVar126 = auVar107._16_4_ + auVar200._16_4_;
  fVar128 = auVar107._20_4_ + auVar200._20_4_;
  fVar130 = auVar107._24_4_ + auVar200._24_4_;
  fVar132 = auVar107._28_4_ + auVar200._28_4_;
  auVar200 = vsubps_avx(auVar115,auVar166);
  fVar177 = auVar115._0_4_ + auVar166._0_4_;
  fVar179 = auVar115._4_4_ + auVar166._4_4_;
  fVar181 = auVar115._8_4_ + auVar166._8_4_;
  fVar183 = auVar115._12_4_ + auVar166._12_4_;
  fVar188 = auVar115._16_4_ + auVar166._16_4_;
  fVar140 = auVar115._20_4_ + auVar166._20_4_;
  fVar141 = auVar115._24_4_ + auVar166._24_4_;
  fVar163 = auVar200._0_4_;
  fVar89 = auVar200._4_4_;
  auVar42._4_4_ = fVar120 * fVar89;
  auVar42._0_4_ = fVar111 * fVar163;
  fVar90 = auVar200._8_4_;
  auVar42._8_4_ = fVar122 * fVar90;
  fVar91 = auVar200._12_4_;
  auVar42._12_4_ = fVar124 * fVar91;
  fVar92 = auVar200._16_4_;
  auVar42._16_4_ = fVar126 * fVar92;
  fVar162 = auVar200._20_4_;
  auVar42._20_4_ = fVar128 * fVar162;
  fVar171 = auVar200._24_4_;
  auVar42._24_4_ = fVar130 * fVar171;
  auVar42._28_4_ = fVar88;
  fVar164 = auVar148._0_4_;
  fVar172 = auVar148._4_4_;
  auVar43._4_4_ = fVar172 * fVar179;
  auVar43._0_4_ = fVar164 * fVar177;
  fVar174 = auVar148._8_4_;
  auVar43._8_4_ = fVar174 * fVar181;
  fVar176 = auVar148._12_4_;
  auVar43._12_4_ = fVar176 * fVar183;
  fVar178 = auVar148._16_4_;
  auVar43._16_4_ = fVar178 * fVar188;
  fVar180 = auVar148._20_4_;
  auVar43._20_4_ = fVar180 * fVar140;
  fVar182 = auVar148._24_4_;
  auVar43._24_4_ = fVar182 * fVar141;
  auVar43._28_4_ = fVar158;
  auVar107 = vsubps_avx(auVar43,auVar42);
  fVar173 = auVar246._0_4_;
  fVar175 = auVar246._4_4_;
  auVar44._4_4_ = fVar175 * fVar179;
  auVar44._0_4_ = fVar173 * fVar177;
  fVar177 = auVar246._8_4_;
  auVar44._8_4_ = fVar177 * fVar181;
  fVar179 = auVar246._12_4_;
  auVar44._12_4_ = fVar179 * fVar183;
  fVar181 = auVar246._16_4_;
  auVar44._16_4_ = fVar181 * fVar188;
  fVar183 = auVar246._20_4_;
  auVar44._20_4_ = fVar183 * fVar140;
  fVar188 = auVar246._24_4_;
  auVar44._24_4_ = fVar188 * fVar141;
  auVar44._28_4_ = fVar88 + auVar166._28_4_;
  auVar45._4_4_ = fVar190 * fVar89;
  auVar45._0_4_ = fVar189 * fVar163;
  auVar45._8_4_ = fVar191 * fVar90;
  auVar45._12_4_ = fVar192 * fVar91;
  auVar45._16_4_ = fVar193 * fVar92;
  auVar45._20_4_ = fVar109 * fVar162;
  auVar45._24_4_ = fVar110 * fVar171;
  auVar45._28_4_ = fVar158;
  auVar115 = vsubps_avx(auVar45,auVar44);
  auVar46._4_4_ = fVar172 * fVar190;
  auVar46._0_4_ = fVar164 * fVar189;
  auVar46._8_4_ = fVar174 * fVar191;
  auVar46._12_4_ = fVar176 * fVar192;
  auVar46._16_4_ = fVar178 * fVar193;
  auVar46._20_4_ = fVar180 * fVar109;
  auVar46._24_4_ = fVar182 * fVar110;
  auVar46._28_4_ = auVar137._28_4_ + fVar158;
  auVar47._4_4_ = fVar175 * fVar120;
  auVar47._0_4_ = fVar173 * fVar111;
  auVar47._8_4_ = fVar177 * fVar122;
  auVar47._12_4_ = fVar179 * fVar124;
  auVar47._16_4_ = fVar181 * fVar126;
  auVar47._20_4_ = fVar183 * fVar128;
  auVar47._24_4_ = fVar188 * fVar130;
  auVar47._28_4_ = fVar132;
  auVar137 = vsubps_avx(auVar47,auVar46);
  local_1360._0_4_ = local_1360._4_4_;
  fStack_1358 = (float)local_1360._4_4_;
  fStack_1354 = (float)local_1360._4_4_;
  fStack_1350 = (float)local_1360._4_4_;
  fStack_134c = (float)local_1360._4_4_;
  fStack_1348 = (float)local_1360._4_4_;
  fStack_1344 = (float)local_1360._4_4_;
  auVar108._0_4_ =
       fVar80 * auVar107._0_4_ + auVar137._0_4_ * fVar81 + (float)local_1360._4_4_ * auVar115._0_4_;
  auVar108._4_4_ =
       fVar80 * auVar107._4_4_ + auVar137._4_4_ * fVar81 + (float)local_1360._4_4_ * auVar115._4_4_;
  auVar108._8_4_ =
       fVar80 * auVar107._8_4_ + auVar137._8_4_ * fVar81 + (float)local_1360._4_4_ * auVar115._8_4_;
  auVar108._12_4_ =
       fVar80 * auVar107._12_4_ +
       auVar137._12_4_ * fVar81 + (float)local_1360._4_4_ * auVar115._12_4_;
  auVar108._16_4_ =
       fVar80 * auVar107._16_4_ +
       auVar137._16_4_ * fVar81 + (float)local_1360._4_4_ * auVar115._16_4_;
  auVar108._20_4_ =
       fVar80 * auVar107._20_4_ +
       auVar137._20_4_ * fVar81 + (float)local_1360._4_4_ * auVar115._20_4_;
  auVar108._24_4_ =
       fVar80 * auVar107._24_4_ +
       auVar137._24_4_ * fVar81 + (float)local_1360._4_4_ * auVar115._24_4_;
  auVar108._28_4_ = fVar132 + auVar137._28_4_ + fVar132;
  local_1000._0_4_ = auVar108._0_4_ + local_1020._0_4_ + fVar196;
  local_1000._4_4_ = auVar108._4_4_ + local_1020._4_4_ + fVar206;
  local_1000._8_4_ = auVar108._8_4_ + local_1020._8_4_ + auVar197._8_4_;
  local_1000._12_4_ = auVar108._12_4_ + local_1020._12_4_ + auVar197._12_4_;
  local_1000._16_4_ = auVar108._16_4_ + local_1020._16_4_ + auVar199._16_4_;
  local_1000._20_4_ = auVar108._20_4_ + local_1020._20_4_ + auVar199._20_4_;
  local_1000._24_4_ = auVar108._24_4_ + local_1020._24_4_ + auVar202._24_4_;
  local_1000._28_4_ = auVar108._28_4_ + local_1020._28_4_ + auVar202._28_4_;
  auVar137 = vminps_avx(local_1020,auVar202);
  auVar137 = vminps_avx(auVar137,auVar108);
  auVar160._8_4_ = 0x7fffffff;
  auVar160._0_8_ = 0x7fffffff7fffffff;
  auVar160._12_4_ = 0x7fffffff;
  auVar160._16_4_ = 0x7fffffff;
  auVar160._20_4_ = 0x7fffffff;
  auVar160._24_4_ = 0x7fffffff;
  auVar160._28_4_ = 0x7fffffff;
  local_1040 = vandps_avx(auVar160,local_1000);
  fVar88 = local_1040._0_4_ * 1.1920929e-07;
  fVar189 = local_1040._4_4_ * 1.1920929e-07;
  auVar48._4_4_ = fVar189;
  auVar48._0_4_ = fVar88;
  fVar190 = local_1040._8_4_ * 1.1920929e-07;
  auVar48._8_4_ = fVar190;
  fVar191 = local_1040._12_4_ * 1.1920929e-07;
  auVar48._12_4_ = fVar191;
  fVar192 = local_1040._16_4_ * 1.1920929e-07;
  auVar48._16_4_ = fVar192;
  fVar193 = local_1040._20_4_ * 1.1920929e-07;
  auVar48._20_4_ = fVar193;
  fVar109 = local_1040._24_4_ * 1.1920929e-07;
  auVar48._24_4_ = fVar109;
  auVar48._28_4_ = 0x34000000;
  auVar149._0_8_ = CONCAT44(fVar189,fVar88) ^ 0x8000000080000000;
  auVar149._8_4_ = -fVar190;
  auVar149._12_4_ = -fVar191;
  auVar149._16_4_ = -fVar192;
  auVar149._20_4_ = -fVar193;
  auVar149._24_4_ = -fVar109;
  auVar149._28_4_ = 0xb4000000;
  auVar137 = vcmpps_avx(auVar137,auVar149,5);
  auVar115 = vmaxps_avx(local_1020,auVar202);
  auVar107 = vmaxps_avx(auVar115,auVar108);
  auVar107 = vcmpps_avx(auVar107,auVar48,2);
  auVar107 = vorps_avx(auVar137,auVar107);
  if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar107 >> 0x7f,0) == '\0') &&
        (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar107 >> 0xbf,0) == '\0') &&
      (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar107[0x1f]) {
LAB_0034b0da:
    auVar93 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
  }
  else {
    auVar49._4_4_ = fVar220 * fVar103;
    auVar49._0_4_ = fVar217 * fVar102;
    auVar49._8_4_ = fVar221 * fVar104;
    auVar49._12_4_ = fVar222 * fVar26;
    auVar49._16_4_ = fVar223 * fVar27;
    auVar49._20_4_ = fVar224 * fVar28;
    auVar49._24_4_ = fVar225 * fVar29;
    auVar49._28_4_ = auVar137._28_4_;
    auVar50._4_4_ = fVar234 * fVar205;
    auVar50._0_4_ = fVar230 * fVar195;
    auVar50._8_4_ = fVar236 * fVar208;
    auVar50._12_4_ = fVar238 * fVar210;
    auVar50._16_4_ = fVar240 * fVar212;
    auVar50._20_4_ = fVar242 * fVar214;
    auVar50._24_4_ = fVar244 * fVar216;
    auVar50._28_4_ = 0x34000000;
    auVar148 = vsubps_avx(auVar50,auVar49);
    auVar51._4_4_ = fVar172 * fVar205;
    auVar51._0_4_ = fVar164 * fVar195;
    auVar51._8_4_ = fVar174 * fVar208;
    auVar51._12_4_ = fVar176 * fVar210;
    auVar51._16_4_ = fVar178 * fVar212;
    auVar51._20_4_ = fVar180 * fVar214;
    auVar51._24_4_ = fVar182 * fVar216;
    auVar51._28_4_ = auVar115._28_4_;
    auVar52._4_4_ = fVar220 * fVar89;
    auVar52._0_4_ = fVar217 * fVar163;
    auVar52._8_4_ = fVar221 * fVar90;
    auVar52._12_4_ = fVar222 * fVar91;
    auVar52._16_4_ = fVar223 * fVar92;
    auVar52._20_4_ = fVar224 * fVar162;
    auVar52._24_4_ = fVar225 * fVar171;
    auVar52._28_4_ = local_1040._28_4_;
    auVar166 = vsubps_avx(auVar52,auVar51);
    auVar137 = vandps_avx(auVar160,auVar49);
    auVar115 = vandps_avx(auVar160,auVar51);
    auVar137 = vcmpps_avx(auVar137,auVar115,1);
    local_1140 = vblendvps_avx(auVar166,auVar148,auVar137);
    auVar53._4_4_ = fVar235 * fVar89;
    auVar53._0_4_ = fVar231 * fVar163;
    auVar53._8_4_ = fVar237 * fVar90;
    auVar53._12_4_ = fVar239 * fVar91;
    auVar53._16_4_ = fVar241 * fVar92;
    auVar53._20_4_ = fVar243 * fVar162;
    auVar53._24_4_ = fVar245 * fVar171;
    auVar53._28_4_ = auVar200._28_4_;
    auVar54._4_4_ = fVar235 * fVar103;
    auVar54._0_4_ = fVar231 * fVar102;
    auVar54._8_4_ = fVar237 * fVar104;
    auVar54._12_4_ = fVar239 * fVar26;
    auVar54._16_4_ = fVar241 * fVar27;
    auVar54._20_4_ = fVar243 * fVar28;
    auVar54._24_4_ = fVar245 * fVar29;
    auVar54._28_4_ = auVar137._28_4_;
    auVar93 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
    auVar55._4_4_ = fVar204 * fVar205;
    auVar55._0_4_ = fVar194 * fVar195;
    auVar55._8_4_ = fVar207 * fVar208;
    auVar55._12_4_ = fVar209 * fVar210;
    auVar55._16_4_ = fVar211 * fVar212;
    auVar55._20_4_ = fVar213 * fVar214;
    auVar55._24_4_ = fVar215 * fVar216;
    auVar55._28_4_ = auVar148._28_4_;
    auVar148 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = fVar205 * fVar175;
    auVar56._0_4_ = fVar195 * fVar173;
    auVar56._8_4_ = fVar208 * fVar177;
    auVar56._12_4_ = fVar210 * fVar179;
    auVar56._16_4_ = fVar212 * fVar181;
    auVar56._20_4_ = fVar214 * fVar183;
    auVar56._24_4_ = fVar216 * fVar188;
    auVar56._28_4_ = auVar166._28_4_;
    auVar200 = vsubps_avx(auVar56,auVar53);
    auVar137 = vandps_avx(auVar160,auVar55);
    auVar115 = vandps_avx(auVar160,auVar53);
    auVar137 = vcmpps_avx(auVar137,auVar115,1);
    local_1120 = vblendvps_avx(auVar200,auVar148,auVar137);
    auVar57._4_4_ = fVar220 * fVar175;
    auVar57._0_4_ = fVar217 * fVar173;
    auVar57._8_4_ = fVar221 * fVar177;
    auVar57._12_4_ = fVar222 * fVar179;
    auVar57._16_4_ = fVar223 * fVar181;
    auVar57._20_4_ = fVar224 * fVar183;
    auVar57._24_4_ = fVar225 * fVar188;
    auVar57._28_4_ = auVar246._28_4_;
    auVar58._4_4_ = fVar204 * fVar220;
    auVar58._0_4_ = fVar194 * fVar217;
    auVar58._8_4_ = fVar207 * fVar221;
    auVar58._12_4_ = fVar209 * fVar222;
    auVar58._16_4_ = fVar211 * fVar223;
    auVar58._20_4_ = fVar213 * fVar224;
    auVar58._24_4_ = fVar215 * fVar225;
    auVar58._28_4_ = auVar137._28_4_;
    auVar59._4_4_ = fVar235 * fVar234;
    auVar59._0_4_ = fVar231 * fVar230;
    auVar59._8_4_ = fVar237 * fVar236;
    auVar59._12_4_ = fVar239 * fVar238;
    auVar59._16_4_ = fVar241 * fVar240;
    auVar59._20_4_ = fVar243 * fVar242;
    auVar59._24_4_ = fVar245 * fVar244;
    auVar59._28_4_ = auVar148._28_4_;
    auVar60._4_4_ = fVar235 * fVar172;
    auVar60._0_4_ = fVar231 * fVar164;
    auVar60._8_4_ = fVar237 * fVar174;
    auVar60._12_4_ = fVar239 * fVar176;
    auVar60._16_4_ = fVar241 * fVar178;
    auVar60._20_4_ = fVar243 * fVar180;
    auVar60._24_4_ = fVar245 * fVar182;
    auVar60._28_4_ = local_1120._28_4_;
    auVar148 = vsubps_avx(auVar58,auVar59);
    auVar200 = vsubps_avx(auVar60,auVar57);
    auVar137 = vandps_avx(auVar160,auVar59);
    auVar115 = vandps_avx(auVar160,auVar57);
    auVar115 = vcmpps_avx(auVar137,auVar115,1);
    local_1100 = vblendvps_avx(auVar200,auVar148,auVar115);
    auVar105 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
    fVar163 = local_1140._0_4_ * fVar80 +
              local_1100._0_4_ * fVar81 + local_1120._0_4_ * (float)local_1360._4_4_;
    fVar88 = local_1140._4_4_ * fVar80 +
             local_1100._4_4_ * fVar81 + local_1120._4_4_ * (float)local_1360._4_4_;
    fVar102 = local_1140._8_4_ * fVar80 +
              local_1100._8_4_ * fVar81 + local_1120._8_4_ * (float)local_1360._4_4_;
    fVar103 = local_1140._12_4_ * fVar80 +
              local_1100._12_4_ * fVar81 + local_1120._12_4_ * (float)local_1360._4_4_;
    fVar89 = local_1140._16_4_ * fVar80 +
             local_1100._16_4_ * fVar81 + local_1120._16_4_ * (float)local_1360._4_4_;
    fVar104 = local_1140._20_4_ * fVar80 +
              local_1100._20_4_ * fVar81 + local_1120._20_4_ * (float)local_1360._4_4_;
    fVar81 = local_1140._24_4_ * fVar80 +
             local_1100._24_4_ * fVar81 + local_1120._24_4_ * (float)local_1360._4_4_;
    fVar80 = auVar137._28_4_ + auVar137._28_4_ + 0.0;
    auVar98._0_4_ = fVar163 + fVar163;
    auVar98._4_4_ = fVar88 + fVar88;
    auVar98._8_4_ = fVar102 + fVar102;
    auVar98._12_4_ = fVar103 + fVar103;
    auVar98._16_4_ = fVar89 + fVar89;
    auVar98._20_4_ = fVar104 + fVar104;
    auVar98._24_4_ = fVar81 + fVar81;
    auVar98._28_4_ = fVar80 + fVar80;
    fVar163 = local_1140._0_4_ * fVar157 + local_1100._0_4_ * fVar156 + local_1120._0_4_ * fVar155;
    fVar121 = local_1140._4_4_ * fVar121 + local_1100._4_4_ * fVar229 + local_1120._4_4_ * fVar226;
    fVar123 = local_1140._8_4_ * fVar127 + local_1100._8_4_ * fVar125 + local_1120._8_4_ * fVar123;
    fVar125 = local_1140._12_4_ * fVar16 + local_1100._12_4_ * fVar131 + local_1120._12_4_ * fVar129
    ;
    fVar127 = local_1140._16_4_ * fVar19 + local_1100._16_4_ * fVar18 + local_1120._16_4_ * fVar17;
    fVar129 = local_1140._20_4_ * fVar22 + local_1100._20_4_ * fVar21 + local_1120._20_4_ * fVar20;
    fVar131 = local_1140._24_4_ * fVar25 + local_1100._24_4_ * fVar24 + local_1120._24_4_ * fVar23;
    auVar137 = vrcpps_avx(auVar98);
    fVar81 = auVar137._0_4_;
    fVar80 = auVar137._4_4_;
    auVar61._4_4_ = auVar98._4_4_ * fVar80;
    auVar61._0_4_ = auVar98._0_4_ * fVar81;
    fVar155 = auVar137._8_4_;
    auVar61._8_4_ = auVar98._8_4_ * fVar155;
    fVar156 = auVar137._12_4_;
    auVar61._12_4_ = auVar98._12_4_ * fVar156;
    fVar157 = auVar137._16_4_;
    auVar61._16_4_ = auVar98._16_4_ * fVar157;
    fVar226 = auVar137._20_4_;
    auVar61._20_4_ = auVar98._20_4_ * fVar226;
    fVar229 = auVar137._24_4_;
    auVar61._24_4_ = auVar98._24_4_ * fVar229;
    auVar61._28_4_ = uStack_1284;
    auVar154._8_4_ = 0x3f800000;
    auVar154._0_8_ = 0x3f8000003f800000;
    auVar154._12_4_ = 0x3f800000;
    auVar154._16_4_ = 0x3f800000;
    auVar154._20_4_ = 0x3f800000;
    auVar154._24_4_ = 0x3f800000;
    auVar154._28_4_ = 0x3f800000;
    auVar137 = vsubps_avx(auVar154,auVar61);
    local_1380._4_4_ = (fVar121 + fVar121) * (fVar80 + fVar80 * auVar137._4_4_);
    local_1380._0_4_ = (fVar163 + fVar163) * (fVar81 + fVar81 * auVar137._0_4_);
    local_1380._8_4_ = (fVar123 + fVar123) * (fVar155 + fVar155 * auVar137._8_4_);
    local_1380._12_4_ = (fVar125 + fVar125) * (fVar156 + fVar156 * auVar137._12_4_);
    local_1380._16_4_ = (fVar127 + fVar127) * (fVar157 + fVar157 * auVar137._16_4_);
    local_1380._20_4_ = (fVar129 + fVar129) * (fVar226 + fVar226 * auVar137._20_4_);
    local_1380._24_4_ = (fVar131 + fVar131) * (fVar229 + fVar229 * auVar137._24_4_);
    local_1380._28_4_ = auVar137._28_4_;
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar117._4_4_ = uVar3;
    auVar117._0_4_ = uVar3;
    auVar117._8_4_ = uVar3;
    auVar117._12_4_ = uVar3;
    auVar117._16_4_ = uVar3;
    auVar117._20_4_ = uVar3;
    auVar117._24_4_ = uVar3;
    auVar117._28_4_ = uVar3;
    auVar137 = vcmpps_avx(auVar117,local_1380,2);
    auVar94 = vshufps_avx(auVar93,auVar93,0);
    auVar139._16_16_ = auVar94;
    auVar139._0_16_ = auVar94;
    auVar107 = vcmpps_avx(local_1380,auVar139,2);
    auVar137 = vandps_avx(auVar107,auVar137);
    auVar94 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
    auVar105 = vpand_avx(auVar94,auVar105);
    auVar94 = vpmovsxwd_avx(auVar105);
    auVar152 = vpshufd_avx(auVar105,0xee);
    auVar152 = vpmovsxwd_avx(auVar152);
    auVar118._16_16_ = auVar152;
    auVar118._0_16_ = auVar94;
    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar118 >> 0x7f,0) == '\0') &&
          (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB161(auVar152 >> 0x3f,0) == '\0') &&
        (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar152[0xf])
    goto LAB_0034b0da;
    auVar137 = vcmpps_avx(auVar98,_DAT_01faff00,4);
    auVar94 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
    auVar105 = vpand_avx(auVar105,auVar94);
    auVar94 = vpmovsxwd_avx(auVar105);
    auVar105 = vpunpckhwd_avx(auVar105,auVar105);
    local_11c0._16_16_ = auVar105;
    local_11c0._0_16_ = auVar94;
    if ((((((((local_11c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_11c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_11c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_11c0 >> 0x7f,0) == '\0') &&
          (local_11c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB161(auVar105 >> 0x3f,0) == '\0') &&
        (local_11c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0xf]
       ) goto LAB_0034b0da;
    uVar70 = pGVar11->_geomID;
    uVar68 = pGVar11->_primID;
    local_1240 = local_1020;
    uStack_1458 = auVar197._8_8_;
    uStack_1450 = auVar199._16_8_;
    uStack_1448 = auVar202._24_8_;
    local_1220 = auVar197._0_8_;
    uStack_1218 = uStack_1458;
    uStack_1210 = uStack_1450;
    uStack_1208 = uStack_1448;
    local_1200 = local_1000;
    local_11e0 = &local_13d8;
    local_1160 = local_1380;
    pGVar78 = (context->scene->geometries).items[uVar70].ptr;
    if ((pGVar78->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
      auVar152 = *(undefined1 (*) [16])(local_13d8 + local_13d0 * 4);
      auVar93 = auVar152;
      if (2 < local_13c8) {
        auVar93 = *(undefined1 (*) [16])(local_13d8 + local_13d0 * 8);
      }
      auVar137 = vrcpps_avx(local_1000);
      fVar81 = auVar137._0_4_;
      fVar80 = auVar137._4_4_;
      auVar62._4_4_ = local_1000._4_4_ * fVar80;
      auVar62._0_4_ = local_1000._0_4_ * fVar81;
      fVar155 = auVar137._8_4_;
      auVar62._8_4_ = local_1000._8_4_ * fVar155;
      fVar156 = auVar137._12_4_;
      auVar62._12_4_ = local_1000._12_4_ * fVar156;
      fVar157 = auVar137._16_4_;
      auVar62._16_4_ = local_1000._16_4_ * fVar157;
      fVar226 = auVar137._20_4_;
      auVar62._20_4_ = local_1000._20_4_ * fVar226;
      fVar229 = auVar137._24_4_;
      auVar62._24_4_ = local_1000._24_4_ * fVar229;
      auVar62._28_4_ = local_1000._28_4_;
      auVar150._8_4_ = 0x3f800000;
      auVar150._0_8_ = 0x3f8000003f800000;
      auVar150._12_4_ = 0x3f800000;
      auVar150._16_4_ = 0x3f800000;
      auVar150._20_4_ = 0x3f800000;
      auVar150._24_4_ = 0x3f800000;
      auVar150._28_4_ = 0x3f800000;
      auVar107 = vsubps_avx(auVar150,auVar62);
      auVar84._0_4_ = fVar81 + fVar81 * auVar107._0_4_;
      auVar84._4_4_ = fVar80 + fVar80 * auVar107._4_4_;
      auVar84._8_4_ = fVar155 + fVar155 * auVar107._8_4_;
      auVar84._12_4_ = fVar156 + fVar156 * auVar107._12_4_;
      auVar84._16_4_ = fVar157 + fVar157 * auVar107._16_4_;
      auVar84._20_4_ = fVar226 + fVar226 * auVar107._20_4_;
      auVar84._24_4_ = fVar229 + fVar229 * auVar107._24_4_;
      auVar84._28_4_ = auVar137._28_4_ + auVar107._28_4_;
      auVar99._8_4_ = 0x219392ef;
      auVar99._0_8_ = 0x219392ef219392ef;
      auVar99._12_4_ = 0x219392ef;
      auVar99._16_4_ = 0x219392ef;
      auVar99._20_4_ = 0x219392ef;
      auVar99._24_4_ = 0x219392ef;
      auVar99._28_4_ = 0x219392ef;
      auVar137 = vcmpps_avx(local_1040,auVar99,5);
      auVar137 = vandps_avx(auVar137,auVar84);
      auVar63._4_4_ = local_1020._4_4_ * auVar137._4_4_;
      auVar63._0_4_ = local_1020._0_4_ * auVar137._0_4_;
      auVar63._8_4_ = local_1020._8_4_ * auVar137._8_4_;
      auVar63._12_4_ = local_1020._12_4_ * auVar137._12_4_;
      auVar63._16_4_ = local_1020._16_4_ * auVar137._16_4_;
      auVar63._20_4_ = local_1020._20_4_ * auVar137._20_4_;
      auVar63._24_4_ = local_1020._24_4_ * auVar137._24_4_;
      auVar63._28_4_ = auVar84._28_4_;
      auVar107 = vminps_avx(auVar63,auVar150);
      auVar64._4_4_ = auVar137._4_4_ * fVar206;
      auVar64._0_4_ = auVar137._0_4_ * fVar196;
      auVar64._8_4_ = auVar137._8_4_ * auVar197._8_4_;
      auVar64._12_4_ = auVar137._12_4_ * auVar197._12_4_;
      auVar64._16_4_ = auVar137._16_4_ * auVar199._16_4_;
      auVar64._20_4_ = auVar137._20_4_ * auVar199._20_4_;
      auVar64._24_4_ = auVar137._24_4_ * auVar202._24_4_;
      auVar64._28_4_ = auVar137._28_4_;
      auVar137 = vminps_avx(auVar64,auVar150);
      auVar184 = *(undefined1 (*) [16])local_13d8;
      if (local_13d0 == 2) {
        auVar184 = vpshufd_avx(auVar184,0x54);
        auVar152 = vpshufd_avx(auVar152,0x54);
        auVar93 = vpshufd_avx(auVar93,0x54);
      }
      auVar151._16_16_ = auVar152;
      auVar151._0_16_ = auVar184;
      auVar168._16_16_ = auVar93;
      auVar168._0_16_ = auVar152;
      auVar30 = vunpcklps_avx(auVar151,auVar168);
      auVar184 = vpshufd_avx(auVar184,0xa5);
      auVar112 = vpshufd_avx(auVar152,0xa5);
      auVar161._0_16_ = vpsrld_avx(auVar30._0_16_,0x10);
      auVar198 = vpsrld_avx(auVar30._16_16_,0x10);
      auVar161._16_16_ = auVar198;
      auVar203._16_16_ = auVar112;
      auVar203._0_16_ = auVar184;
      auVar152 = vpshufd_avx(auVar152,0x94);
      auVar93 = vpshufd_avx(auVar93,0x94);
      auVar169._0_16_ = vpsrld_avx(auVar184,0x10);
      auVar184 = vpsrld_avx(auVar112,0x10);
      auVar169._16_16_ = auVar184;
      auVar186._16_16_ = auVar93;
      auVar186._0_16_ = auVar152;
      auVar146._0_16_ = vpsrld_avx(auVar152,0x10);
      auVar152 = vpsrld_avx(auVar93,0x10);
      auVar146._16_16_ = auVar152;
      auVar119._8_4_ = 0xffff;
      auVar119._0_8_ = 0xffff0000ffff;
      auVar119._12_4_ = 0xffff;
      auVar119._16_4_ = 0xffff;
      auVar119._20_4_ = 0xffff;
      auVar119._24_4_ = 0xffff;
      auVar119._28_4_ = 0xffff;
      auVar115 = vandps_avx(auVar203,auVar119);
      auVar148 = vcvtdq2ps_avx(auVar115);
      auVar115 = vandps_avx(auVar186,auVar119);
      auVar200 = vcvtdq2ps_avx(auVar115);
      auVar166 = vcvtdq2ps_avx(auVar169);
      auVar246 = vcvtdq2ps_avx(auVar146);
      auVar170._8_4_ = 0x3f800000;
      auVar170._0_8_ = 0x3f8000003f800000;
      auVar170._12_4_ = 0x3f800000;
      auVar170._16_4_ = 0x3f800000;
      auVar170._20_4_ = 0x3f800000;
      auVar170._24_4_ = 0x3f800000;
      auVar170._28_4_ = 0x3f800000;
      auVar115 = vsubps_avx(auVar170,auVar107);
      auVar31 = vsubps_avx(auVar115,auVar137);
      auVar115 = vandps_avx(auVar30,auVar119);
      auVar115 = vcvtdq2ps_avx(auVar115);
      auVar30 = vcvtdq2ps_avx(auVar161);
      local_11a0[0] =
           auVar200._0_4_ * 0.00012207031 * auVar137._0_4_ +
           auVar107._0_4_ * auVar148._0_4_ * 0.00012207031 +
           auVar31._0_4_ * auVar115._0_4_ * 0.00012207031;
      local_11a0[1] =
           auVar200._4_4_ * 0.00012207031 * auVar137._4_4_ +
           auVar107._4_4_ * auVar148._4_4_ * 0.00012207031 +
           auVar31._4_4_ * auVar115._4_4_ * 0.00012207031;
      local_11a0[2] =
           auVar200._8_4_ * 0.00012207031 * auVar137._8_4_ +
           auVar107._8_4_ * auVar148._8_4_ * 0.00012207031 +
           auVar31._8_4_ * auVar115._8_4_ * 0.00012207031;
      local_11a0[3] =
           auVar200._12_4_ * 0.00012207031 * auVar137._12_4_ +
           auVar107._12_4_ * auVar148._12_4_ * 0.00012207031 +
           auVar31._12_4_ * auVar115._12_4_ * 0.00012207031;
      fStack_1190 = auVar200._16_4_ * 0.00012207031 * auVar137._16_4_ +
                    auVar107._16_4_ * auVar148._16_4_ * 0.00012207031 +
                    auVar31._16_4_ * auVar115._16_4_ * 0.00012207031;
      fStack_118c = auVar200._20_4_ * 0.00012207031 * auVar137._20_4_ +
                    auVar107._20_4_ * auVar148._20_4_ * 0.00012207031 +
                    auVar31._20_4_ * auVar115._20_4_ * 0.00012207031;
      fStack_1188 = auVar200._24_4_ * 0.00012207031 * auVar137._24_4_ +
                    auVar107._24_4_ * auVar148._24_4_ * 0.00012207031 +
                    auVar31._24_4_ * auVar115._24_4_ * 0.00012207031;
      fStack_1184 = auVar200._28_4_ + auVar148._28_4_ + auVar115._28_4_;
      local_1180[0] =
           auVar166._0_4_ * 0.00012207031 * auVar107._0_4_ +
           auVar137._0_4_ * auVar246._0_4_ * 0.00012207031 +
           auVar31._0_4_ * auVar30._0_4_ * 0.00012207031;
      local_1180[1] =
           auVar166._4_4_ * 0.00012207031 * auVar107._4_4_ +
           auVar137._4_4_ * auVar246._4_4_ * 0.00012207031 +
           auVar31._4_4_ * auVar30._4_4_ * 0.00012207031;
      local_1180[2] =
           auVar166._8_4_ * 0.00012207031 * auVar107._8_4_ +
           auVar137._8_4_ * auVar246._8_4_ * 0.00012207031 +
           auVar31._8_4_ * auVar30._8_4_ * 0.00012207031;
      local_1180[3] =
           auVar166._12_4_ * 0.00012207031 * auVar107._12_4_ +
           auVar137._12_4_ * auVar246._12_4_ * 0.00012207031 +
           auVar31._12_4_ * auVar30._12_4_ * 0.00012207031;
      fStack_1170 = auVar166._16_4_ * 0.00012207031 * auVar107._16_4_ +
                    auVar137._16_4_ * auVar246._16_4_ * 0.00012207031 +
                    auVar31._16_4_ * auVar30._16_4_ * 0.00012207031;
      fStack_116c = auVar166._20_4_ * 0.00012207031 * auVar107._20_4_ +
                    auVar137._20_4_ * auVar246._20_4_ * 0.00012207031 +
                    auVar31._20_4_ * auVar30._20_4_ * 0.00012207031;
      fStack_1168 = auVar166._24_4_ * 0.00012207031 * auVar107._24_4_ +
                    auVar137._24_4_ * auVar246._24_4_ * 0.00012207031 +
                    auVar31._24_4_ * auVar30._24_4_ * 0.00012207031;
      fStack_1164 = auVar166._28_4_ + auVar246._28_4_ + auVar31._28_4_;
      auVar85._16_16_ = auVar105;
      auVar85._0_16_ = auVar94;
      auVar100._8_4_ = 0x7f800000;
      auVar100._0_8_ = 0x7f8000007f800000;
      auVar100._12_4_ = 0x7f800000;
      auVar100._16_4_ = 0x7f800000;
      auVar100._20_4_ = 0x7f800000;
      auVar100._24_4_ = 0x7f800000;
      auVar100._28_4_ = 0x7f800000;
      auVar87 = ZEXT3264(local_1380);
      auVar137 = vblendvps_avx(auVar100,local_1380,auVar85);
      auVar107 = vshufps_avx(auVar137,auVar137,0xb1);
      auVar107 = vminps_avx(auVar137,auVar107);
      auVar115 = vshufpd_avx(auVar107,auVar107,5);
      auVar107 = vminps_avx(auVar107,auVar115);
      auVar115 = vperm2f128_avx(auVar107,auVar107,1);
      auVar107 = vminps_avx(auVar107,auVar115);
      auVar107 = vcmpps_avx(auVar137,auVar107,0);
      auVar115 = local_11c0 & auVar107;
      auVar137 = local_11c0;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0x7f,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0xbf,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar115[0x1f] < '\0') {
        auVar137 = vandps_avx(auVar107,local_11c0);
      }
      uVar71 = vmovmskps_avx(auVar137);
      uVar14 = 0;
      if (uVar71 != 0) {
        for (; (uVar71 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
        }
      }
      uVar73 = (ulong)uVar14;
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar78->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
        fVar81 = local_11a0[uVar73];
        fVar80 = local_1180[uVar73];
        uVar3 = *(undefined4 *)(local_1140 + uVar73 * 4);
        uVar8 = *(undefined4 *)(local_1120 + uVar73 * 4);
        uVar9 = *(undefined4 *)(local_1100 + uVar73 * 4);
        auVar93 = ZEXT416(*(uint *)(local_1160 + uVar73 * 4));
        *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1160 + uVar73 * 4);
        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar9;
        *(float *)(ray + k * 4 + 0xf0) = fVar81;
        *(float *)(ray + k * 4 + 0x100) = fVar80;
        *(uint *)(ray + k * 4 + 0x110) = uVar68;
        *(uint *)(ray + k * 4 + 0x120) = uVar70;
        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
      }
      else {
        auVar105 = vpshufd_avx(ZEXT416(uVar70),0);
        _local_1360 = auVar105;
        _local_12e0 = vpshufd_avx(ZEXT416(uVar68),0);
        _auStack_12d0 = auVar145._16_16_;
        _auStack_1390 = auVar116._16_16_;
        _local_13a0 = *local_1318;
        auVar187 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
        _auStack_13b8 = auVar147._8_24_;
        local_13c0 = pGVar78;
        local_1260 = local_11c0;
        while( true ) {
          local_10a0 = local_11a0[uVar73];
          local_1090 = local_1180[uVar73];
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1160 + uVar73 * 4);
          local_1310.context = context->user;
          local_10d0 = *(undefined4 *)(local_1140 + uVar73 * 4);
          uVar3 = *(undefined4 *)(local_1120 + uVar73 * 4);
          auVar114._4_4_ = uVar3;
          auVar114._0_4_ = uVar3;
          auVar114._8_4_ = uVar3;
          auVar114._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(local_1100 + uVar73 * 4);
          local_10b0._4_4_ = uVar3;
          local_10b0._0_4_ = uVar3;
          local_10b0._8_4_ = uVar3;
          local_10b0._12_4_ = uVar3;
          uStack_10cc = local_10d0;
          uStack_10c8 = local_10d0;
          uStack_10c4 = local_10d0;
          local_10c0 = auVar114;
          fStack_109c = local_10a0;
          fStack_1098 = local_10a0;
          fStack_1094 = local_10a0;
          fStack_108c = local_1090;
          fStack_1088 = local_1090;
          fStack_1084 = local_1090;
          local_1080 = local_12e0;
          uStack_1078 = uStack_12d8;
          local_1070 = _local_1360;
          vcmpps_avx(ZEXT1632(_local_1360),ZEXT1632(_local_1360),0xf);
          uStack_105c = (local_1310.context)->instID[0];
          local_1060 = uStack_105c;
          uStack_1058 = uStack_105c;
          uStack_1054 = uStack_105c;
          uStack_1050 = (local_1310.context)->instPrimID[0];
          uStack_104c = uStack_1050;
          uStack_1048 = uStack_1050;
          uStack_1044 = uStack_1050;
          local_1330 = _local_13a0;
          local_1310.valid = (int *)local_1330;
          local_1310.geometryUserPtr = pGVar78->userPtr;
          local_1310.hit = (RTCHitN *)&local_10d0;
          local_1310.N = 4;
          auVar105 = auVar187._0_16_;
          local_1310.ray = (RTCRayN *)ray;
          if (pGVar78->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar78->intersectionFilterN)(&local_1310);
            auVar187 = ZEXT1664(auVar105);
            auVar87 = ZEXT3264(local_1380);
            pGVar78 = local_13c0;
          }
          if (local_1330 == (undefined1  [16])0x0) {
            auVar105 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
            auVar105 = auVar105 ^ _DAT_01f7ae20;
          }
          else {
            p_Var12 = context->args->filter;
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar78->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var12)(&local_1310);
              auVar187 = ZEXT1664(auVar105);
              auVar87 = ZEXT3264(local_1380);
              pGVar78 = local_13c0;
            }
            auVar94 = vpcmpeqd_avx(local_1330,_DAT_01f7aa10);
            auVar152 = vpcmpeqd_avx(auVar114,auVar114);
            auVar105 = auVar94 ^ auVar152;
            if (local_1330 != (undefined1  [16])0x0) {
              auVar94 = auVar94 ^ auVar152;
              auVar152 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])local_1310.hit);
              *(undefined1 (*) [16])(local_1310.ray + 0xc0) = auVar152;
              auVar152 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])(local_1310.hit + 0x10));
              *(undefined1 (*) [16])(local_1310.ray + 0xd0) = auVar152;
              auVar152 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])(local_1310.hit + 0x20));
              *(undefined1 (*) [16])(local_1310.ray + 0xe0) = auVar152;
              auVar152 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])(local_1310.hit + 0x30));
              *(undefined1 (*) [16])(local_1310.ray + 0xf0) = auVar152;
              auVar152 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])(local_1310.hit + 0x40));
              *(undefined1 (*) [16])(local_1310.ray + 0x100) = auVar152;
              auVar152 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])(local_1310.hit + 0x50));
              *(undefined1 (*) [16])(local_1310.ray + 0x110) = auVar152;
              auVar152 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])(local_1310.hit + 0x60));
              *(undefined1 (*) [16])(local_1310.ray + 0x120) = auVar152;
              auVar152 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])(local_1310.hit + 0x70));
              *(undefined1 (*) [16])(local_1310.ray + 0x130) = auVar152;
              auVar94 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])(local_1310.hit + 0x80));
              *(undefined1 (*) [16])(local_1310.ray + 0x140) = auVar94;
            }
          }
          auVar96._8_8_ = 0x100000001;
          auVar96._0_8_ = 0x100000001;
          if ((auVar96 & auVar105) == (undefined1  [16])0x0) {
            *(int *)(ray + k * 4 + 0x80) = auVar187._0_4_;
          }
          else {
            auVar187 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
          }
          *(undefined4 *)(local_1260 + uVar73 * 4) = 0;
          auVar93 = auVar187._0_16_;
          auVar105 = vshufps_avx(auVar93,auVar93,0);
          auVar86._16_16_ = auVar105;
          auVar86._0_16_ = auVar105;
          auVar107 = vcmpps_avx(auVar87._0_32_,auVar86,2);
          auVar137 = vandps_avx(auVar107,local_1260);
          local_1260 = local_1260 & auVar107;
          if ((((((((local_1260 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_1260 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1260 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_1260 >> 0x7f,0) == '\0') &&
                (local_1260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_1260 >> 0xbf,0) == '\0') &&
              (local_1260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_1260[0x1f]) break;
          auVar101._8_4_ = 0x7f800000;
          auVar101._0_8_ = 0x7f8000007f800000;
          auVar101._12_4_ = 0x7f800000;
          auVar101._16_4_ = 0x7f800000;
          auVar101._20_4_ = 0x7f800000;
          auVar101._24_4_ = 0x7f800000;
          auVar101._28_4_ = 0x7f800000;
          auVar107 = vblendvps_avx(auVar101,auVar87._0_32_,auVar137);
          auVar115 = vshufps_avx(auVar107,auVar107,0xb1);
          auVar115 = vminps_avx(auVar107,auVar115);
          auVar145 = vshufpd_avx(auVar115,auVar115,5);
          auVar115 = vminps_avx(auVar115,auVar145);
          auVar145 = vperm2f128_avx(auVar115,auVar115,1);
          auVar115 = vminps_avx(auVar115,auVar145);
          auVar115 = vcmpps_avx(auVar107,auVar115,0);
          auVar145 = auVar137 & auVar115;
          auVar107 = auVar137;
          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar145 >> 0x7f,0) != '\0') ||
                (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar145 >> 0xbf,0) != '\0') ||
              (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar145[0x1f] < '\0') {
            auVar107 = vandps_avx(auVar115,auVar137);
          }
          uVar68 = vmovmskps_avx(auVar107);
          uVar70 = 0;
          if (uVar68 != 0) {
            for (; (uVar68 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
            }
          }
          uVar73 = (ulong)uVar70;
          local_1260 = auVar137;
        }
      }
    }
  }
  auVar105 = vshufps_avx(auVar93,auVar93,0);
  auVar87 = ZEXT1664(auVar105);
LAB_0034ab68:
  if (pauVar69 == (undefined1 (*) [16])&local_fa0) {
    return;
  }
  goto LAB_00349c68;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }